

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void value_suite::fail_null_as_string(void)

{
  __type v;
  bool bVar1;
  error_code eVar2;
  int local_290 [2];
  error_category *local_288;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_278;
  type local_258;
  undefined1 local_238 [8];
  error_code error_3;
  variable data_3;
  int local_1f0 [2];
  error_category *local_1e8;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_1d8;
  type local_1b8;
  undefined1 local_198 [8];
  error_code error_2;
  variable data_2;
  int local_150 [2];
  error_category *local_148;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_138;
  type local_118;
  undefined1 local_f8 [8];
  error_code error_1;
  variable data_1;
  int local_b0 [2];
  error_category *local_a8;
  string local_90 [32];
  type local_70;
  undefined1 local_48 [8];
  error_code error;
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&error._M_cat);
  std::error_code::error_code((error_code *)local_48);
  trial::dynamic::basic_variable<std::allocator<char>>::value<std::__cxx11::string>
            (&local_70,(basic_variable<std::allocator<char>> *)&error._M_cat,(error_code *)local_48)
  ;
  std::__cxx11::string::string(local_90);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,std::__cxx11::string>
            ("data.value<std::string>(error)","std::string{}",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x14a4,"void value_suite::fail_null_as_string()",&local_70,local_90);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string((string *)&local_70);
  eVar2 = trial::dynamic::make_error_code(incompatible_type);
  local_a8 = eVar2._M_cat;
  local_b0[0] = eVar2._M_value;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::error_code,std::error_code>
            ("error","make_error_code(incompatible_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x14a5,"void value_suite::fail_null_as_string()",local_48,local_b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&error._M_cat);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&error_1._M_cat);
  std::error_code::error_code((error_code *)local_f8);
  trial::dynamic::basic_variable<std::allocator<char>>::value<std::__cxx11::wstring>
            (&local_118,(basic_variable<std::allocator<char>> *)&error_1._M_cat,
             (error_code *)local_f8);
  std::__cxx11::wstring::wstring((wstring *)&local_138);
  v = std::operator==(&local_118,&local_138);
  boost::detail::test_impl
            ("data.value<std::wstring>(error) == std::wstring{}",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x14aa,"void value_suite::fail_null_as_string()",v);
  std::__cxx11::wstring::~wstring((wstring *)&local_138);
  std::__cxx11::wstring::~wstring((wstring *)&local_118);
  eVar2 = trial::dynamic::make_error_code(incompatible_type);
  local_148 = eVar2._M_cat;
  local_150[0] = eVar2._M_value;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::error_code,std::error_code>
            ("error","make_error_code(incompatible_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x14ab,"void value_suite::fail_null_as_string()",local_f8,local_150);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&error_1._M_cat);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&error_2._M_cat);
  std::error_code::error_code((error_code *)local_198);
  trial::dynamic::basic_variable<std::allocator<char>>::value<std::__cxx11::u16string>
            (&local_1b8,(basic_variable<std::allocator<char>> *)&error_2._M_cat,
             (error_code *)local_198);
  std::__cxx11::u16string::u16string((u16string *)&local_1d8);
  bVar1 = std::operator==(&local_1b8,&local_1d8);
  boost::detail::test_impl
            ("data.value<std::u16string>(error) == std::u16string{}",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x14b0,"void value_suite::fail_null_as_string()",bVar1);
  std::__cxx11::u16string::~u16string((u16string *)&local_1d8);
  std::__cxx11::u16string::~u16string((u16string *)&local_1b8);
  eVar2 = trial::dynamic::make_error_code(incompatible_type);
  local_1e8 = eVar2._M_cat;
  local_1f0[0] = eVar2._M_value;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::error_code,std::error_code>
            ("error","make_error_code(incompatible_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x14b1,"void value_suite::fail_null_as_string()",local_198,local_1f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&error_2._M_cat);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&error_3._M_cat);
  std::error_code::error_code((error_code *)local_238);
  trial::dynamic::basic_variable<std::allocator<char>>::value<std::__cxx11::u32string>
            (&local_258,(basic_variable<std::allocator<char>> *)&error_3._M_cat,
             (error_code *)local_238);
  std::__cxx11::u32string::u32string((u32string *)&local_278);
  bVar1 = std::operator==(&local_258,&local_278);
  boost::detail::test_impl
            ("data.value<std::u32string>(error) == std::u32string{}",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x14b6,"void value_suite::fail_null_as_string()",bVar1);
  std::__cxx11::u32string::~u32string((u32string *)&local_278);
  std::__cxx11::u32string::~u32string((u32string *)&local_258);
  eVar2 = trial::dynamic::make_error_code(incompatible_type);
  local_288 = eVar2._M_cat;
  local_290[0] = eVar2._M_value;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::error_code,std::error_code>
            ("error","make_error_code(incompatible_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x14b7,"void value_suite::fail_null_as_string()",local_238,local_290);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&error_3._M_cat);
  return;
}

Assistant:

void fail_null_as_string()
{
    {
        variable data;
        std::error_code error;
        TRIAL_PROTOCOL_TEST_EQUAL(data.value<std::string>(error), std::string{});
        TRIAL_PROTOCOL_TEST_EQUAL(error, make_error_code(incompatible_type));
    }
    {
        variable data;
        std::error_code error;
        TRIAL_PROTOCOL_TEST(data.value<std::wstring>(error) == std::wstring{});
        TRIAL_PROTOCOL_TEST_EQUAL(error, make_error_code(incompatible_type));
    }
    {
        variable data;
        std::error_code error;
        TRIAL_PROTOCOL_TEST(data.value<std::u16string>(error) == std::u16string{});
        TRIAL_PROTOCOL_TEST_EQUAL(error, make_error_code(incompatible_type));
    }
    {
        variable data;
        std::error_code error;
        TRIAL_PROTOCOL_TEST(data.value<std::u32string>(error) == std::u32string{});
        TRIAL_PROTOCOL_TEST_EQUAL(error, make_error_code(incompatible_type));
    }
}